

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O2

void __thiscall
solitaire::graphics::
SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderCopyFailedDuringTextureRenderingInFullWindow_Test
::TestBody(SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderCopyFailedDuringTextureRenderingInFullWindow_Test
           *this)

{
  WrapperMock *this_00;
  bool bVar1;
  TypedExpectation<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  *this_01;
  pointer *__ptr;
  _Any_data local_128 [2];
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
  local_108;
  ReturnAction<int> local_f0;
  TextureId local_dc;
  MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&> local_d8;
  MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  local_c0;
  MatcherBase<const_std::optional<SDL_Rect>_&> local_58;
  MatcherBase<const_std::optional<SDL_Rect>_&> local_40;
  undefined8 local_28;
  undefined8 local_20;
  
  this_00 = &((this->super_SDLGraphicsSystemWithLoadedTexture).
              super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.sdlMock.
             rawPointer)->super_WrapperMock;
  local_20 = 2;
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
              *)&local_108,(PointerMatcher *)&local_20);
  local_28 = 3;
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&> *)
             &local_d8,(PointerMatcher *)&local_28);
  local_40.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<std::optional<SDL_Rect>const&>::
       GetVTable<testing::internal::MatcherBase<std::optional<SDL_Rect>const&>::ValuePolicy<testing::internal::EqMatcher<std::nullopt_t>,true>>()
       ::kVTable;
  local_40.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002f60a0;
  local_58.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<std::optional<SDL_Rect>const&>::
       GetVTable<testing::internal::MatcherBase<std::optional<SDL_Rect>const&>::ValuePolicy<testing::internal::EqMatcher<std::nullopt_t>,true>>()
       ::kVTable;
  local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002f60a0;
  SDL::WrapperMock::gmock_renderCopy
            (&local_c0,this_00,
             (Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>
              *)&local_108,
             (Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&> *)
             &local_d8,(Matcher<const_std::optional<SDL_Rect>_&> *)&local_40,
             (Matcher<const_std::optional<SDL_Rect>_&> *)&local_58);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
            ::InternalExpectedAt
                      (&local_c0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x17e,"*sdlMock",
                       "renderCopy(Pointer(rendererPtr), Pointer(texture0Ptr), Eq(std::nullopt), Eq(std::nullopt))"
                      );
  testing::internal::ReturnAction<int>::ReturnAction(&local_f0,-1);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
              *)local_128,(ReturnAction *)&local_f0);
  testing::internal::
  TypedExpectation<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  ::WillOnce(this_01,(Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
                      *)local_128);
  std::_Function_base::~_Function_base((_Function_base *)local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f0.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  ::~_Tuple_impl(&local_c0.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                );
  testing::internal::MatcherBase<const_std::optional<SDL_Rect>_&>::~MatcherBase(&local_58);
  testing::internal::MatcherBase<const_std::optional<SDL_Rect>_&>::~MatcherBase(&local_40);
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>::
  ~MatcherBase(&local_d8);
  testing::internal::
  MatcherBase<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~MatcherBase(&local_108);
  local_c0.function_mocker_ =
       (FunctionMocker<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
        *)((long)&local_c0.matchers_.
                  super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                  .
                  super__Tuple_impl<1UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                  .
                  super__Tuple_impl<2UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
                  .super__Tuple_impl<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>_> + 8);
  local_c0.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  .
  super__Tuple_impl<1UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  .
  super__Tuple_impl<2UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  .super__Tuple_impl<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>.
  super__Head_base<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_false>._M_head_impl.
  super_MatcherBase<const_std::optional<SDL_Rect>_&>.vtable_ = (VTable *)0x0;
  local_c0.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  .
  super__Tuple_impl<1UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  .
  super__Tuple_impl<2UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  .super__Tuple_impl<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>.
  super__Head_base<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_false>._M_head_impl.
  super_MatcherBase<const_std::optional<SDL_Rect>_&>.buffer_.ptr = (void *)0x0;
  local_c0.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  .
  super__Tuple_impl<1UL,_testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  .
  super__Tuple_impl<2UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>
  .super__Tuple_impl<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>_>.
  super__Head_base<3UL,_testing::Matcher<const_std::optional<SDL_Rect>_&>,_false>._M_head_impl.
  super_MatcherBase<const_std::optional<SDL_Rect>_&>.super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_dc.t = (anonymous_namespace)::textureId0;
    SDLGraphicsSystem::renderTextureInFullWindow
              (&(this->super_SDLGraphicsSystemWithLoadedTexture).
                super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.system,
               &local_dc);
  }
  std::__cxx11::string::assign((char *)&local_c0);
  testing::Message::Message((Message *)local_128);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_108,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x180,(char *)local_c0.function_mocker_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_128);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
  if ((long *)local_128[0]._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_128[0]._0_8_ + 8))();
  }
  std::__cxx11::string::~string((string *)&local_c0);
  SDLGraphicsSystemWithLoadedTexture::expectQuitSystemWithLoadedTexture
            (&this->super_SDLGraphicsSystemWithLoadedTexture);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithLoadedTexture,
       throwIfSDLRenderCopyFailedDuringTextureRenderingInFullWindow)
{
    EXPECT_CALL(*sdlMock,
        renderCopy(Pointer(rendererPtr), Pointer(texture0Ptr),
                   Eq(std::nullopt), Eq(std::nullopt))
    ).WillOnce(Return(failure));

    EXPECT_THROW(system.renderTextureInFullWindow(textureId0), std::runtime_error);
    expectQuitSystemWithLoadedTexture();
}